

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::Triangle::Intersect(Triangle *this,Ray *ray,Float tMax)

{
  Point3f *pPVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  TriangleIntersection *pTVar4;
  long in_RSI;
  optional<pbrt::ShapeIntersection> *in_RDI;
  long in_FS_OFFSET;
  undefined8 uVar5;
  Vector3<float> VVar6;
  Point3f *in_stack_00000138;
  Point3f *in_stack_00000140;
  Point3f *in_stack_00000148;
  Float in_stack_00000154;
  Ray *in_stack_00000158;
  SurfaceInteraction intr;
  optional<pbrt::TriangleIntersection> triIsect;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  int *v;
  TriangleMesh *mesh;
  Vector3f *in_stack_00000700;
  Float in_stack_0000070c;
  TriangleIntersection *in_stack_00000710;
  int in_stack_0000071c;
  TriangleMesh *in_stack_00000720;
  ShapeIntersection *in_stack_fffffffffffffce8;
  SurfaceInteraction *in_stack_fffffffffffffcf0;
  optional<pbrt::ShapeIntersection> *this_00;
  optional<pbrt::ShapeIntersection> local_1a8;
  undefined4 local_88;
  optional local_74 [20];
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  int *local_30;
  TriangleMesh *local_28;
  
  *(long *)(in_FS_OFFSET + -0x4b0) = *(long *)(in_FS_OFFSET + -0x4b0) + 1;
  local_28 = GetMesh((Triangle *)0x78e99c);
  local_30 = local_28->vertexIndices + *(int *)(in_RSI + 4) * 3;
  local_38 = local_28->p[*local_30].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_28->p + *local_30;
  local_40._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_40._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_48 = local_28->p[local_30[1]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_28->p + local_30[1];
  local_50._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_50._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_58 = local_28->p[local_30[2]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_28->p + local_30[2];
  local_60._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_60._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  IntersectTriangle(in_stack_00000158,in_stack_00000154,in_stack_00000148,in_stack_00000140,
                    in_stack_00000138);
  bVar3 = pstd::optional::operator_cast_to_bool(local_74);
  if (bVar3) {
    pstd::optional<pbrt::TriangleIntersection>::operator*
              ((optional<pbrt::TriangleIntersection> *)0x78eb30);
    uVar5 = 0;
    VVar6 = Tuple3<pbrt::Vector3,_float>::operator-
                      ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffffcf0);
    local_1a8.optionalValue._16_4_ = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar2._8_8_ = uVar5;
    auVar2._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_1a8.optionalValue._8_8_ = vmovlpd_avx(auVar2);
    local_1a8.optionalValue._24_8_ = local_1a8.optionalValue._8_8_;
    local_1a8.optionalValue._32_4_ = local_1a8.optionalValue._16_4_;
    InteractionFromIntersection
              (in_stack_00000720,in_stack_0000071c,in_stack_00000710,in_stack_0000070c,
               in_stack_00000700);
    *(long *)(in_FS_OFFSET + -0x4a8) = *(long *)(in_FS_OFFSET + -0x4a8) + 1;
    SurfaceInteraction::SurfaceInteraction
              (in_stack_fffffffffffffcf0,&in_stack_fffffffffffffce8->intr);
    this_00 = &local_1a8;
    pTVar4 = pstd::optional<pbrt::TriangleIntersection>::operator->
                       ((optional<pbrt::TriangleIntersection> *)0x78ec0b);
    *(Float *)&this_00->optionalValue = pTVar4->t;
    pstd::optional<pbrt::ShapeIntersection>::optional(this_00,in_stack_fffffffffffffce8);
  }
  else {
    memset(in_RDI,0,0x108);
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
  }
  local_88 = 1;
  pstd::optional<pbrt::TriangleIntersection>::~optional
            ((optional<pbrt::TriangleIntersection> *)0x78ec4e);
  return in_RDI;
}

Assistant:

pstd::optional<ShapeIntersection> Triangle::Intersect(const Ray &ray, Float tMax) const {
#ifndef PBRT_IS_GPU_CODE
    ++nTriTests;
#endif
    // Get triangle vertices in _p0_, _p1_, and _p2_
    const TriangleMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[3 * triIndex];
    Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

    pstd::optional<TriangleIntersection> triIsect =
        IntersectTriangle(ray, tMax, p0, p1, p2);
    if (!triIsect)
        return {};

    SurfaceInteraction intr =
        InteractionFromIntersection(mesh, triIndex, *triIsect, ray.time, -ray.d);
#ifndef PBRT_IS_GPU_CODE
    ++nTriHits;
#endif
    return ShapeIntersection{intr, triIsect->t};
}